

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

bool __thiscall QFSFileEngine::supportsExtension(QFSFileEngine *this,Extension extension)

{
  QFSFileEnginePrivate *pQVar1;
  ulong uVar2;
  int in_ESI;
  long *in_RDI;
  QFSFileEnginePrivate *d;
  bool local_1;
  
  pQVar1 = d_func((QFSFileEngine *)0x1260af);
  if (((in_ESI == 0) && (pQVar1->fh != (FILE *)0x0)) &&
     (uVar2 = (**(code **)(*in_RDI + 0x48))(), (uVar2 & 1) != 0)) {
    local_1 = true;
  }
  else if ((in_ESI == 1) && (pQVar1->fh != (FILE *)0x0)) {
    local_1 = true;
  }
  else if ((in_ESI == 1) &&
          ((pQVar1->fd != -1 && (uVar2 = (**(code **)(*in_RDI + 0x48))(), (uVar2 & 1) != 0)))) {
    local_1 = true;
  }
  else if ((in_ESI == 3) || (in_ESI == 2)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QFSFileEngine::supportsExtension(Extension extension) const
{
    Q_D(const QFSFileEngine);
    if (extension == AtEndExtension && d->fh && isSequential())
        return true;
    if (extension == FastReadLineExtension && d->fh)
        return true;
    if (extension == FastReadLineExtension && d->fd != -1 && isSequential())
        return true;
    if (extension == UnMapExtension || extension == MapExtension)
        return true;
    return false;
}